

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O0

void __thiscall
jessilib::io::formatted_message::formatted_message<jessilib::io::text&,jessilib::io::text&>
          (formatted_message *this,u8string *in_format,text *args,text *args_1)

{
  initializer_list<jessilib::io::text> __l;
  text *local_d0;
  allocator<jessilib::io::text> local_ad [13];
  text *local_a0;
  text local_98;
  text local_68;
  undefined1 local_38 [24];
  text *args_local_1;
  text *args_local;
  u8string *in_format_local;
  formatted_message *this_local;
  
  local_38._16_8_ = args_1;
  args_local_1 = args;
  args_local = (text *)in_format;
  in_format_local = &this->m_format;
  std::__cxx11::u8string::u8string((u8string *)this,in_format);
  local_a0 = &local_98;
  text::text(local_a0,args_local_1);
  local_a0 = &local_68;
  text::text(local_a0,(text *)local_38._16_8_);
  local_38._0_8_ = &local_98;
  local_38._8_8_ = 2;
  std::allocator<jessilib::io::text>::allocator(local_ad);
  __l._M_len = local_38._8_8_;
  __l._M_array = (iterator)local_38._0_8_;
  std::vector<jessilib::io::text,_std::allocator<jessilib::io::text>_>::vector
            (&this->m_message,__l,local_ad);
  std::allocator<jessilib::io::text>::~allocator(local_ad);
  local_d0 = (text *)local_38;
  do {
    local_d0 = local_d0 + -1;
    text::~text(local_d0);
  } while (local_d0 != &local_98);
  return;
}

Assistant:

formatted_message(std::u8string in_format, Args&& ... args)
		: m_format{ std::move(in_format) },
		m_message{ std::forward<Args>(args)... } {
		// Empty ctor body
	}